

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_scalingFactorSelfReferencingUnits1_Test::TestBody
          (Units_scalingFactorSelfReferencingUnits1_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  UnitsPtr X;
  UnitsPtr mX;
  ModelPtr model;
  long *local_b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  string *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  string *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  shared_ptr *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  libcellml::Model::create();
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"X","");
  libcellml::Units::create((string *)&local_58);
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  psVar1 = local_58;
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"mole","");
  libcellml::Units::addUnit(psVar1);
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"mX","");
  libcellml::Units::create((string *)&local_48);
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"X","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"milli","");
  pcVar3 = "";
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"","");
  libcellml::Units::addUnit(local_48,(string *)&local_b8,1.0,1.0,(string *)local_98);
  if (local_78[0] != local_68) {
    operator_delete(local_78[0],local_68[0] + 1);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  libcellml::Model::addUnits(local_38);
  libcellml::Model::addUnits(local_38);
  local_98[0] = (long *)&DAT_408f400000000000;
  local_78[0] = (long *)libcellml::Units::scalingFactor
                                  ((shared_ptr *)&local_48,(shared_ptr *)&local_58,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_b8,"1000.0","libcellml::Units::scalingFactor(mX, X)",
             (double *)local_98,(double *)local_78);
  if (local_b8._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_98);
    if (local_b0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x9d9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
    if (local_98[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_98[0] != (long *)0x0)) {
        (**(code **)(*local_98[0] + 8))();
      }
      local_98[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"litre","");
  pcVar3 = "";
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"","");
  libcellml::Units::addUnit(local_58,-1.0,(string *)&local_b8);
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  local_98[0] = (long *)&DAT_408f400000000000;
  local_78[0] = (long *)libcellml::Units::scalingFactor
                                  ((shared_ptr *)&local_48,(shared_ptr *)&local_58,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_b8,"1000.0","libcellml::Units::scalingFactor(mX, X)",
             (double *)local_98,(double *)local_78);
  if (local_b8._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_98);
    if (local_b0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x9dd,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_78,(Message *)local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_78);
    if (local_98[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_98[0] != (long *)0x0)) {
        (**(code **)(*local_98[0] + 8))();
      }
      local_98[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return;
}

Assistant:

TEST(Units, scalingFactorSelfReferencingUnits1)
{
    auto model = libcellml::Model::create();
    auto X = libcellml::Units::create("X");
    X->addUnit("mole");
    auto mX = libcellml::Units::create("mX");
    mX->addUnit("X", "milli");
    model->addUnits(X);
    model->addUnits(mX);

    EXPECT_EQ(1000.0, libcellml::Units::scalingFactor(mX, X));

    X->addUnit("litre", -1.0);

    EXPECT_EQ(1000.0, libcellml::Units::scalingFactor(mX, X));
}